

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void calculateShadowEdgesRoi(Mat *img,Rect *roi_to_clear,Mat *edge_image,int canny_thrs)

{
  int in_R8D;
  Mat img_gray;
  _InputArray local_168;
  undefined8 uStack_150;
  undefined8 local_148;
  Mat *local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  _InputArray local_120 [4];
  undefined4 local_c0 [2];
  _InputArray *local_b8;
  undefined8 local_b0;
  undefined4 local_a8 [2];
  Mat *local_a0;
  undefined8 local_98;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90);
  if ((*(ushort *)img & 0xff8) == 0) {
    cv::Mat::operator=(local_90,img);
  }
  else {
    local_120[0].sz.width = 0;
    local_120[0].sz.height = 0;
    local_120[0].flags = 0x1010000;
    local_168.sz.width = 0;
    local_168.sz.height = 0;
    local_168.flags = 0x2010000;
    local_168.obj = local_90;
    local_120[0].obj = img;
    cv::cvtColor((cv *)local_120,&local_168,(_OutputArray *)0x6,0,in_R8D);
  }
  local_120[0].sz.width = 0;
  local_120[0].sz.height = 0;
  local_120[0].flags = 0x1010000;
  local_168.sz.width = 0;
  local_168.sz.height = 0;
  local_168.flags = 0x2010000;
  local_168.obj = edge_image;
  local_120[0].obj = local_90;
  cv::Canny(local_120,(_OutputArray *)&local_168,(double)canny_thrs,(double)canny_thrs,3,false);
  cv::Mat::Mat((Mat *)local_120,edge_image,(Rect_ *)roi_to_clear);
  local_168.obj = &local_148;
  local_148 = 0;
  local_168.flags = -0x3efdfffa;
  local_168.sz.width = 1;
  local_168.sz.height = 1;
  cv::noArray();
  cv::Mat::setTo(local_120,&local_168);
  cv::Mat::~Mat((Mat *)local_120);
  local_138 = 0;
  local_148._0_4_ = 0x1010000;
  local_98 = 0;
  local_a8[0] = 0x2010000;
  local_140 = edge_image;
  local_a0 = edge_image;
  cv::Mat::Mat((Mat *)local_120);
  local_b0 = 0;
  local_c0[0] = 0x1010000;
  local_128 = 0xffffffffffffffff;
  local_168.flags = -1;
  local_168._4_4_ = 0x7fefffff;
  local_168.obj = (void *)0x7fefffffffffffff;
  local_168.sz.width = -1;
  local_168.sz.height = 0x7fefffff;
  uStack_150 = 0x7fefffffffffffff;
  local_b8 = local_120;
  cv::dilate(&local_148,local_a8,local_c0,&local_128,1,0,&local_168);
  cv::Mat::~Mat((Mat *)local_120);
  local_138 = 0;
  local_148 = CONCAT44(local_148._4_4_,0x1010000);
  local_98 = 0;
  local_a8[0] = 0x2010000;
  local_140 = edge_image;
  local_a0 = edge_image;
  cv::Mat::Mat((Mat *)local_120);
  local_b0 = 0;
  local_c0[0] = 0x1010000;
  local_130 = 0xffffffffffffffff;
  local_168.flags = -1;
  local_168._4_4_ = 0x7fefffff;
  local_168.obj = (void *)0x7fefffffffffffff;
  local_168.sz.width = -1;
  local_168.sz.height = 0x7fefffff;
  uStack_150 = 0x7fefffffffffffff;
  local_b8 = local_120;
  cv::dilate(&local_148,local_a8,local_c0,&local_130,1,0,&local_168);
  cv::Mat::~Mat((Mat *)local_120);
  cv::Mat::~Mat(local_90);
  return;
}

Assistant:

void calculateShadowEdgesRoi(const cv::Mat& img,
    const cv::Rect& roi_to_clear,
    cv::Mat& edge_image,
    int canny_thrs)
{
    cv::Mat img_gray;
    if (img.channels() == 1)
    {
        img_gray = img;
    }
    else
    {
        cv::cvtColor(img, img_gray, cv::COLOR_BGR2GRAY);
    }
    cv::Canny(img_gray, edge_image, canny_thrs, canny_thrs);
    edge_image(roi_to_clear).setTo(0);
    cv::dilate(edge_image, edge_image, cv::Mat());
    cv::dilate(edge_image, edge_image, cv::Mat());
}